

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_self(FuncState *fs,expdesc *e,expdesc *key)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  luaK_exp2anyreg(fs,e);
  if (((e->k == VNONRELOC) && (uVar1 = (e->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (int)uVar1)) {
    fs->freereg = fs->freereg + -1;
  }
  iVar2 = fs->freereg;
  luaK_checkstack(fs,2);
  fs->freereg = fs->freereg + 2;
  iVar3 = (e->u).s.info;
  iVar4 = luaK_exp2RK(fs,key);
  luaK_code(fs,iVar3 << 0x17 | iVar2 << 6 | iVar4 << 0xe | 0xb,fs->ls->lastline);
  if (((key->k == VNONRELOC) && (uVar1 = (key->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (int)uVar1)) {
    fs->freereg = fs->freereg + -1;
  }
  (e->u).s.info = iVar2;
  e->k = VNONRELOC;
  return;
}

Assistant:

void luaK_self (FuncState *fs, expdesc *e, expdesc *key) {
  int func;
  luaK_exp2anyreg(fs, e);
  freeexp(fs, e);
  func = fs->freereg;
  luaK_reserveregs(fs, 2);
  luaK_codeABC(fs, OP_SELF, func, e->u.s.info, luaK_exp2RK(fs, key));
  freeexp(fs, key);
  e->u.s.info = func;
  e->k = VNONRELOC;
}